

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O3

CURLcode cf_tcp_connect(Curl_cfilter *cf,Curl_easy *data,_Bool blocking,_Bool *done)

{
  uint uVar1;
  void *pvVar2;
  curl_trc_feat *pcVar3;
  _Bool _Var4;
  uint uVar5;
  CURLcode CVar6;
  int iVar7;
  int *piVar8;
  int iVar9;
  char *pcVar10;
  curltime cVar11;
  char buffer [256];
  char local_138 [264];
  
  if ((cf->field_0x24 & 1) == 0) {
    if (blocking) {
      return CURLE_UNSUPPORTED_PROTOCOL;
    }
    pvVar2 = cf->ctx;
    *done = false;
    iVar9 = *(int *)((long)pvVar2 + 0x98);
    CVar6 = CURLE_COULDNT_CONNECT;
    if (iVar9 == -1) {
      CVar6 = cf_socket_open(cf,data);
      if (CVar6 == CURLE_OK) {
        if ((cf->field_0x24 & 1) != 0) goto LAB_00115944;
        iVar7 = do_connect((Curl_cfilter *)cf->ctx,data,
                           (_Bool)((byte)(*(uint *)&cf->conn->bits >> 0x17) & 1));
        piVar8 = __errno_location();
        iVar9 = *piVar8;
        set_local_ip((Curl_cfilter *)cf->ctx,data);
        if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
            ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level)
             ))) && (0 < cf->cft->log_level)) {
          Curl_trc_cf_infof(data,cf,"local address %s port %d...",(long)pvVar2 + 0xca,
                            (ulong)*(uint *)((long)pvVar2 + 0xfc));
        }
        if (iVar7 != -1) {
          iVar9 = *(curl_socket_t *)((long)pvVar2 + 0x98);
          CVar6 = CURLE_OK;
          goto LAB_00115826;
        }
        CVar6 = socket_connect_result(data,(char *)((long)pvVar2 + 0x9c),iVar9);
        goto LAB_00115a3c;
      }
    }
    else {
LAB_00115826:
      uVar5 = Curl_socket_check(-1,-1,iVar9,0);
      if (uVar5 != 2) {
        if (uVar5 == 0) {
          if (data == (Curl_easy *)0x0) {
            return CURLE_OK;
          }
          if (((data->set).field_0x8cd & 0x10) == 0) {
            return CURLE_OK;
          }
          pcVar3 = (data->state).feat;
          if ((pcVar3 != (curl_trc_feat *)0x0) && (pcVar3->log_level < 1)) {
            return CURLE_OK;
          }
          if (cf->cft->log_level < 1) {
            return CURLE_OK;
          }
          pcVar10 = "not connected yet";
          goto LAB_00115a15;
        }
        if (((cf->conn->bits).field_0x2 & 0x80) == 0) {
          if ((uVar5 & 4) == 0) goto LAB_00115a3c;
          verifyconnect(*(curl_socket_t *)((long)pvVar2 + 0x98),(int *)((long)pvVar2 + 0x130));
          CVar6 = CURLE_COULDNT_CONNECT;
          goto LAB_00115a44;
        }
      }
      _Var4 = verifyconnect(*(curl_socket_t *)((long)pvVar2 + 0x98),(int *)((long)pvVar2 + 0x130));
      if (_Var4) {
        cVar11 = Curl_now();
        *(time_t *)((long)pvVar2 + 0x110) = cVar11.tv_sec;
        *(int *)((long)pvVar2 + 0x118) = cVar11.tv_usec;
        set_local_ip((Curl_cfilter *)cf->ctx,data);
        *done = true;
        cf->field_0x24 = cf->field_0x24 | 1;
        if (data == (Curl_easy *)0x0) {
          return CURLE_OK;
        }
        if (((data->set).field_0x8cd & 0x10) == 0) {
          return CURLE_OK;
        }
        pcVar3 = (data->state).feat;
        if ((pcVar3 != (curl_trc_feat *)0x0) && (pcVar3->log_level < 1)) {
          return CURLE_OK;
        }
        if (cf->cft->log_level < 1) {
          return CURLE_OK;
        }
        pcVar10 = "connected";
LAB_00115a15:
        Curl_trc_cf_infof(data,cf,pcVar10);
        return CURLE_OK;
      }
LAB_00115a3c:
      if (CVar6 == CURLE_OK) goto LAB_00115948;
    }
LAB_00115a44:
    if (*(int *)((long)pvVar2 + 0x130) != 0) {
      set_local_ip((Curl_cfilter *)cf->ctx,data);
      iVar9 = *(int *)((long)pvVar2 + 0x130);
      (data->state).os_errno = iVar9;
      piVar8 = __errno_location();
      *piVar8 = iVar9;
      if ((((data->set).field_0x8cd & 0x10) != 0) &&
         ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level))))
      {
        uVar5 = *(uint *)((long)pvVar2 + 0xf8);
        uVar1 = *(uint *)((long)pvVar2 + 0xfc);
        pcVar10 = Curl_strerror(iVar9,local_138,0x100);
        Curl_infof(data,"connect to %s port %u from %s port %d failed: %s",(long)pvVar2 + 0x9c,
                   (ulong)uVar5,(long)pvVar2 + 0xca,(ulong)uVar1,pcVar10);
      }
    }
    if (*(int *)((long)pvVar2 + 0x98) != -1) {
      socket_close(data,cf->conn,1,*(int *)((long)pvVar2 + 0x98));
      *(undefined4 *)((long)pvVar2 + 0x98) = 0xffffffff;
    }
    *done = false;
  }
  else {
LAB_00115944:
    *done = true;
LAB_00115948:
    CVar6 = CURLE_OK;
  }
  return CVar6;
}

Assistant:

static CURLcode cf_tcp_connect(struct Curl_cfilter *cf,
                               struct Curl_easy *data,
                               bool blocking, bool *done)
{
  struct cf_socket_ctx *ctx = cf->ctx;
  CURLcode result = CURLE_COULDNT_CONNECT;
  int rc = 0;

  (void)data;
  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  /* TODO: need to support blocking connect? */
  if(blocking)
    return CURLE_UNSUPPORTED_PROTOCOL;

  *done = FALSE; /* a very negative world view is best */
  if(ctx->sock == CURL_SOCKET_BAD) {
    int error;

    result = cf_socket_open(cf, data);
    if(result)
      goto out;

    if(cf->connected) {
      *done = TRUE;
      return CURLE_OK;
    }

    /* Connect TCP socket */
    rc = do_connect(cf, data, cf->conn->bits.tcp_fastopen);
    error = SOCKERRNO;
    set_local_ip(cf, data);
    CURL_TRC_CF(data, cf, "local address %s port %d...",
                ctx->ip.local_ip, ctx->ip.local_port);
    if(-1 == rc) {
      result = socket_connect_result(data, ctx->ip.remote_ip, error);
      goto out;
    }
  }

#ifdef mpeix
  /* Call this function once now, and ignore the results. We do this to
     "clear" the error state on the socket so that we can later read it
     reliably. This is reported necessary on the MPE/iX operating
     system. */
  (void)verifyconnect(ctx->sock, NULL);
#endif
  /* check socket for connect */
  rc = SOCKET_WRITABLE(ctx->sock, 0);

  if(rc == 0) { /* no connection yet */
    CURL_TRC_CF(data, cf, "not connected yet");
    return CURLE_OK;
  }
  else if(rc == CURL_CSELECT_OUT || cf->conn->bits.tcp_fastopen) {
    if(verifyconnect(ctx->sock, &ctx->error)) {
      /* we are connected with TCP, awesome! */
      ctx->connected_at = Curl_now();
      set_local_ip(cf, data);
      *done = TRUE;
      cf->connected = TRUE;
      CURL_TRC_CF(data, cf, "connected");
      return CURLE_OK;
    }
  }
  else if(rc & CURL_CSELECT_ERR) {
    (void)verifyconnect(ctx->sock, &ctx->error);
    result = CURLE_COULDNT_CONNECT;
  }

out:
  if(result) {
    if(ctx->error) {
      set_local_ip(cf, data);
      data->state.os_errno = ctx->error;
      SET_SOCKERRNO(ctx->error);
#ifndef CURL_DISABLE_VERBOSE_STRINGS
      {
        char buffer[STRERROR_LEN];
        infof(data, "connect to %s port %u from %s port %d failed: %s",
              ctx->ip.remote_ip, ctx->ip.remote_port,
              ctx->ip.local_ip, ctx->ip.local_port,
              Curl_strerror(ctx->error, buffer, sizeof(buffer)));
      }
#endif
    }
    if(ctx->sock != CURL_SOCKET_BAD) {
      socket_close(data, cf->conn, TRUE, ctx->sock);
      ctx->sock = CURL_SOCKET_BAD;
    }
    *done = FALSE;
  }
  return result;
}